

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

Promise<void> __thiscall
kj::
newAdaptedPromise<void,kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedSend,kj::(anonymous_namespace)::WebSocketPipeImpl&,kj::OneOf<kj::ArrayPtr<char_const>,kj::ArrayPtr<unsigned_char_const>,kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>>
          (kj *this,WebSocketPipeImpl *adapterConstructorParams,
          OneOf<kj::ArrayPtr<const_char>,_kj::ArrayPtr<const_unsigned_char>,_kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>
          *adapterConstructorParams_1)

{
  WebSocketPipeImpl *params;
  OneOf<kj::ArrayPtr<const_char>,_kj::ArrayPtr<const_unsigned_char>,_kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>
  *params_1;
  PromiseNode *extraout_RDX;
  Promise<void> PVar1;
  Own<kj::_::AdapterPromiseNode<kj::_::Void,_kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedSend>_>
  local_40;
  Own<kj::_::PromiseNode> local_30;
  NoInfer<kj::OneOf<kj::ArrayPtr<const_char>,_kj::ArrayPtr<const_unsigned_char>,_kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>_>
  *local_20;
  OneOf<kj::ArrayPtr<const_char>,_kj::ArrayPtr<const_unsigned_char>,_kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>
  *adapterConstructorParams_local_1;
  WebSocketPipeImpl *adapterConstructorParams_local;
  
  local_20 = adapterConstructorParams_1;
  adapterConstructorParams_local_1 =
       (OneOf<kj::ArrayPtr<const_char>,_kj::ArrayPtr<const_unsigned_char>,_kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>
        *)adapterConstructorParams;
  adapterConstructorParams_local = (WebSocketPipeImpl *)this;
  params = fwd<kj::(anonymous_namespace)::WebSocketPipeImpl&>(adapterConstructorParams);
  params_1 = fwd<kj::OneOf<kj::ArrayPtr<char_const>,kj::ArrayPtr<unsigned_char_const>,kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>>
                       (local_20);
  heap<kj::_::AdapterPromiseNode<kj::_::Void,kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedSend>,kj::(anonymous_namespace)::WebSocketPipeImpl&,kj::OneOf<kj::ArrayPtr<char_const>,kj::ArrayPtr<unsigned_char_const>,kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>>
            ((kj *)&local_40,params,params_1);
  Own<kj::_::PromiseNode>::
  Own<kj::_::AdapterPromiseNode<kj::_::Void,kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedSend>,void>
            (&local_30,&local_40);
  Promise<void>::Promise((Promise<void> *)this,false,&local_30);
  Own<kj::_::PromiseNode>::~Own(&local_30);
  Own<kj::_::AdapterPromiseNode<kj::_::Void,_kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedSend>_>
  ::~Own(&local_40);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar1.super_PromiseBase.node;
}

Assistant:

Promise<T> newAdaptedPromise(Params&&... adapterConstructorParams) {
  return Promise<T>(false, heap<_::AdapterPromiseNode<_::FixVoid<T>, Adapter>>(
      kj::fwd<Params>(adapterConstructorParams)...));
}